

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_scan.cpp
# Opt level: O2

idx_t __thiscall
duckdb::PositionalTableScanner::Refill(PositionalTableScanner *this,ExecutionContext *context)

{
  DataChunk *this_00;
  int iVar1;
  reference this_01;
  NotImplementedException *this_02;
  ulong uVar2;
  idx_t i;
  ulong uVar3;
  allocator local_99;
  idx_t local_98;
  string local_90;
  OperatorSourceInput source_input;
  InterruptState interrupt_state;
  
  uVar3 = (this->source).count;
  uVar2 = this->source_offset;
  this_00 = &this->source;
  if (uVar3 <= uVar2) {
    if (this->exhausted == false) {
      DataChunk::Reset(this_00);
      InterruptState::InterruptState(&interrupt_state);
      source_input.global_state = this->global_state;
      source_input.local_state =
           unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true>
           ::operator*(&this->local_state);
      source_input.interrupt_state = &interrupt_state;
      iVar1 = (*this->table->_vptr_PhysicalOperator[0x11])(this->table,context,this_00);
      if ((char)iVar1 == '\x02') {
        this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_90,
                   "Unexpected interrupt from table Source in PositionalTableScanner refill",
                   &local_99);
        NotImplementedException::NotImplementedException(this_02,&local_90);
        __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      InterruptState::~InterruptState(&interrupt_state);
      uVar3 = (this->source).count;
    }
    this->source_offset = 0;
    uVar2 = 0;
  }
  local_98 = uVar3 - uVar2;
  if ((local_98 == 0) && (this->exhausted == false)) {
    DataChunk::Reset(this_00);
    for (uVar3 = 0;
        uVar3 < (ulong)(((long)(this->source).data.
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->source).data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x68); uVar3 = uVar3 + 1)
    {
      this_01 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,uVar3);
      Vector::SetVectorType(this_01,CONSTANT_VECTOR);
      ConstantVector::SetNull(this_01,true);
    }
    this->exhausted = true;
  }
  return local_98;
}

Assistant:

idx_t Refill(ExecutionContext &context) {
		if (source_offset >= source.size()) {
			if (!exhausted) {
				source.Reset();

				InterruptState interrupt_state;
				OperatorSourceInput source_input {global_state, *local_state, interrupt_state};
				auto source_result = table.GetData(context, source, source_input);
				if (source_result == SourceResultType::BLOCKED) {
					throw NotImplementedException(
					    "Unexpected interrupt from table Source in PositionalTableScanner refill");
				}
			}
			source_offset = 0;
		}

		const auto available = source.size() - source_offset;
		if (!available) {
			if (!exhausted) {
				source.Reset();
				for (idx_t i = 0; i < source.ColumnCount(); ++i) {
					auto &vec = source.data[i];
					vec.SetVectorType(VectorType::CONSTANT_VECTOR);
					ConstantVector::SetNull(vec, true);
				}
				exhausted = true;
			}
		}

		return available;
	}